

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O0

void test_xtc(vector<float,_std::allocator<float>_> *probs,
             vector<float,_std::allocator<float>_> *probs_expected,float p,float t)

{
  sampler_tester *this;
  sampler_tester *in_RSI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  sampler_tester tester;
  llama_sampler *in_stack_ffffffffffffff78;
  llama_token_data_array *in_stack_ffffffffffffff80;
  sampler_tester *in_stack_ffffffffffffff90;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffe0;
  
  sampler_tester::sampler_tester
            (in_RSI,(vector<float,_std::allocator<float>_> *)CONCAT44(in_XMM0_Da,in_XMM1_Da),
             in_stack_ffffffffffffffe0);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x7a,"test_xtc");
  dump(in_stack_ffffffffffffff80);
  printf("-\n");
  this = (sampler_tester *)llama_sampler_init_xtc(in_XMM0_Da,in_XMM1_Da,0);
  sampler_tester::apply(this,in_stack_ffffffffffffff78);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x7c,"test_xtc");
  dump(&this->cur_p);
  printf("-\n");
  sampler_tester::check(in_stack_ffffffffffffff90);
  sampler_tester::~sampler_tester(this);
  return;
}

Assistant:

static void test_xtc(const std::vector<float> & probs, const std::vector<float> & probs_expected, float p, float t) {
    sampler_tester tester(probs, probs_expected);

    DUMP(&tester.cur_p);
    tester.apply(llama_sampler_init_xtc(p, t, 0, 0));
    DUMP(&tester.cur_p);

    tester.check();
}